

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

CharSetNode * __thiscall
UnifiedRegex::CharSetLeaf::ClearRange
          (CharSetLeaf *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint uVar6;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2e4,"(level == 0)","level == 0");
    if (!bVar3) goto LAB_00e6eaa8;
    *puVar4 = 0;
  }
  uVar6 = ~(-1 << ((char)(level << 2) + 8U & 0x1f));
  if (uVar6 < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2e5,"(h <= lim(level))",
                       "The range for clearing provided is invalid for this level.");
    if (!bVar3) goto LAB_00e6eaa8;
    *puVar4 = 0;
  }
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2e6,"(l <= h)","Can\'t clear where lower is bigger than the higher.");
    if (!bVar3) {
LAB_00e6eaa8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (uVar6 != h || l != 0) {
    CharBitvec::ClearRange(&this->vec,l & 0xff,h & 0xff);
    if ((this->vec).vec[0] != 0) {
      return &this->super_CharSetNode;
    }
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      if (uVar5 == 7) break;
      uVar2 = uVar5 + 1;
    } while ((this->vec).vec[uVar5 + 1] == 0);
    if (uVar5 < 7) {
      return &this->super_CharSetNode;
    }
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
               this,0x28);
  }
  return (CharSetNode *)0x0;
}

Assistant:

CharSetNode* CharSetLeaf::ClearRange(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level == 0);
        AssertMsg(h <= lim(level), "The range for clearing provided is invalid for this level.");
        AssertMsg(l <= h, "Can't clear where lower is bigger than the higher.");
        if (l == 0 && h == lim(level))
        {
            return nullptr;
        }

        vec.ClearRange(leafIdx(l), leafIdx(h));

        if (vec.IsEmpty())
        {
            FreeSelf(allocator);
            return nullptr;
        }

        return this;
    }